

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

void ntru_decrypt(uint16_t *plaintext,uint16_t *ciphertext,NTRUKeyPair *keypair)

{
  uint p;
  uint uVar1;
  ushort uVar2;
  uint16_t *out;
  ulong uVar3;
  uint uVar4;
  size_t i;
  ulong uVar5;
  ulong factor1;
  
  p = keypair->p;
  factor1 = (ulong)p;
  uVar4 = keypair->q;
  uVar1 = keypair->w;
  uVar5 = (ulong)uVar1;
  out = (uint16_t *)safemalloc(factor1,2,0);
  ntru_ring_multiply(out,ciphertext,keypair->f3,p,uVar4);
  ntru_mod3(out,out,p,uVar4);
  if (factor1 != 0) {
    uVar3 = 0;
    do {
      out[uVar3] = ((ushort)((uint)(int)(short)out[uVar3] >> 0xf) & 3) + out[uVar3];
      uVar3 = uVar3 + 1;
    } while (factor1 != uVar3);
  }
  ntru_ring_multiply(plaintext,out,keypair->ginv,p,3);
  smemclr(out,factor1 * 2);
  safefree(out);
  uVar4 = p;
  if (p != 0) {
    uVar3 = 0;
    do {
      uVar4 = uVar4 - (plaintext[uVar3] + 0xffff >> 0x10 ^ 1);
      uVar3 = uVar3 + 1;
    } while (factor1 != uVar3);
  }
  uVar2 = -(short)(((uVar1 ^ uVar4) & 0xffff) + 0xffff >> 0x10);
  if (uVar5 != 0) {
    uVar3 = 0;
    do {
      plaintext[uVar3] = (plaintext[uVar3] ^ 1) & uVar2 ^ plaintext[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (uVar1 < p) {
    do {
      plaintext[uVar5] = plaintext[uVar5] & ~uVar2;
      uVar5 = uVar5 + 1;
    } while (factor1 != uVar5);
  }
  return;
}

Assistant:

void ntru_decrypt(uint16_t *plaintext, const uint16_t *ciphertext,
                  NTRUKeyPair *keypair)
{
    unsigned p = keypair->p, q = keypair->q, w = keypair->w;
    uint16_t *tmp = snewn(p, uint16_t);

    ntru_ring_multiply(tmp, ciphertext, keypair->f3, p, q);

    ntru_mod3(tmp, tmp, p, q);
    ntru_normalise(tmp, tmp, p, 3);

    ntru_ring_multiply(plaintext, tmp, keypair->ginv, p, 3);
    ring_free(tmp, p);

    /*
     * With luck, this should have recovered exactly the original
     * plaintext. But, as per the spec, we check whether it has
     * exactly w nonzero coefficients, and if not, then something has
     * gone wrong - and in that situation we time-safely substitute a
     * different output.
     *
     * (I don't know exactly why we do this, but I assume it's because
     * otherwise the mis-decoded output could be made to disgorge a
     * secret about the private key in some way.)
     */

    unsigned weight = p;
    for (size_t i = 0; i < p; i++)
        weight -= iszero(plaintext[i]);
    unsigned ok = iszero(weight ^ w);

    /*
     * The default failure return value consists of w 1s followed by
     * 0s.
     */
    unsigned mask = ok - 1;
    for (size_t i = 0; i < w; i++) {
        uint16_t diff = (1 ^ plaintext[i]) & mask;
        plaintext[i] ^= diff;
    }
    for (size_t i = w; i < p; i++) {
        uint16_t diff = (0 ^ plaintext[i]) & mask;
        plaintext[i] ^= diff;
    }
}